

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void __thiscall vkt::sr::anon_unknown_0::ShaderMatrixCase::setupShader(ShaderMatrixCase *this)

{
  uint uVar1;
  DataType dataType;
  DataType dataType_00;
  MatrixOp op;
  ShaderMatrixCase *pSVar2;
  bool bVar3;
  OperationType OVar4;
  int iVar5;
  DataType DVar6;
  int iVar7;
  char *pcVar8;
  ostream *poVar9;
  int precision;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar10;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 extraout_RDX_15;
  undefined8 extraout_RDX_16;
  undefined8 extraout_RDX_17;
  undefined8 extraout_RDX_18;
  undefined8 extraout_RDX_19;
  undefined8 extraout_RDX_20;
  undefined8 extraout_RDX_21;
  undefined8 extraout_RDX_22;
  long lVar11;
  string *psVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  pointer pbVar14;
  char *pcVar15;
  int colNdx;
  int rowNdx;
  long lVar16;
  ostringstream *poVar17;
  int local_480;
  DataType resultType;
  ShaderMatrixCase *local_478;
  Precision local_46c;
  allocator<char> local_465;
  uint local_464;
  char *local_460;
  uint local_454;
  string *local_450;
  ulong local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440 [2];
  char *local_400;
  string local_3f8;
  string operationValue0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passVars;
  string inValue0;
  string local_380;
  string operationValue1;
  string inValue1;
  ostringstream vtx;
  ostringstream frag;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
  poVar17 = (ostringstream *)&frag;
  if ((this->super_ShaderRenderCase).m_isVertexCase != false) {
    poVar17 = (ostringstream *)&vtx;
  }
  dataType = (this->m_in0).dataType;
  dataType_00 = (this->m_in1).dataType;
  local_450 = (string *)CONCAT44(local_450._4_4_,dataType - TYPE_FLOAT_MAT2);
  local_454 = dataType - TYPE_DOUBLE_MAT2;
  local_464 = dataType_00 - TYPE_FLOAT_MAT2;
  inValue0._M_dataplus._M_p = (pointer)&inValue0.field_2;
  inValue0._M_string_length = 0;
  uVar1 = dataType_00 - TYPE_DOUBLE_MAT2;
  inValue0.field_2._M_local_buf[0] = '\0';
  inValue1._M_dataplus._M_p = (pointer)&inValue1.field_2;
  inValue1._M_string_length = 0;
  inValue1.field_2._M_local_buf[0] = '\0';
  resultType = TYPE_LAST;
  local_46c = (this->m_in0).precision;
  passVars.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  passVars.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  passVars.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  op = this->m_op;
  local_478 = this;
  bVar3 = MatrixCaseUtils::isOperationBinary(op);
  local_460 = (char *)CONCAT71(local_460._1_7_,bVar3);
  operationValue0._M_dataplus._M_p = (pointer)&operationValue0.field_2;
  operationValue0._M_string_length = 0;
  operationValue1._M_dataplus._M_p = (pointer)&operationValue1.field_2;
  operationValue1._M_string_length = 0;
  operationValue0.field_2._M_local_buf[0] = '\0';
  operationValue1.field_2._M_local_buf[0] = '\0';
  DVar6 = dataType;
  switch(op) {
  case OP_MUL:
    if ((8 < (uint)local_450 && 8 < local_454) || (8 < local_464 && 8 < uVar1))
    goto switchD_005a9319_caseD_3;
    iVar7 = glu::getDataTypeMatrixNumColumns(dataType_00);
    iVar5 = glu::getDataTypeMatrixNumRows((local_478->m_in0).dataType);
    DVar6 = glu::getDataTypeMatrix(iVar7,iVar5);
    break;
  default:
switchD_005a9319_caseD_3:
    OVar4 = MatrixCaseUtils::getOperationType(op);
    if ((OVar4 & ~OPERATIONTYPE_BINARY_FUNCTION) == OPERATIONTYPE_UNARY_PREFIX_OPERATOR)
    goto switchD_005a9319_caseD_7;
    if ((uint)local_450 < 9 || local_454 < 9) {
      if (local_464 < 9 || uVar1 < 9) goto switchD_005a9319_caseD_7;
      if (dataType_00 != TYPE_FLOAT) {
        iVar7 = glu::getDataTypeMatrixNumRows(dataType);
        goto LAB_005a942f;
      }
    }
    else {
      DVar6 = resultType;
      if ((local_464 < 9 || uVar1 < 9) && (DVar6 = dataType_00, dataType != TYPE_FLOAT)) {
        iVar7 = glu::getDataTypeMatrixNumColumns(dataType_00);
LAB_005a942f:
        DVar6 = glu::getDataTypeFloatVec(iVar7);
      }
    }
    break;
  case OP_OUTER_PRODUCT:
    iVar7 = glu::getDataTypeScalarSize(dataType_00);
    iVar5 = glu::getDataTypeScalarSize((local_478->m_in0).dataType);
    DVar6 = glu::getDataTypeMatrix(iVar7,iVar5);
    break;
  case OP_TRANSPOSE:
    iVar7 = glu::getDataTypeMatrixNumRows(dataType);
    iVar5 = glu::getDataTypeMatrixNumColumns((local_478->m_in0).dataType);
    DVar6 = glu::getDataTypeMatrix(iVar7,iVar5);
    break;
  case OP_INVERSE:
switchD_005a9319_caseD_7:
    break;
  case OP_DETERMINANT:
    resultType = TYPE_FLOAT;
    DVar6 = resultType;
  }
  resultType = DVar6;
  if ((sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_ == '\0') &&
     (iVar7 = __cxa_guard_acquire(&sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::
                                   header_abi_cxx11_), iVar7 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_,
               "#version 310 es\n",(allocator<char> *)local_440);
    __cxa_atexit(std::__cxx11::string::~string,
                 &sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::
                         header_abi_cxx11_);
  }
  std::operator<<((ostream *)&vtx,
                  (string *)
                  &sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_);
  std::operator<<((ostream *)&frag,
                  (string *)
                  &sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_);
  std::operator<<((ostream *)&vtx,"layout(location = 0) in highp vec4 a_position;\n");
  std::operator<<((ostream *)&frag,"layout(location = 0) out mediump vec4 dEQP_FragColor;\n");
  if ((local_478->super_ShaderRenderCase).m_isVertexCase == true) {
    std::operator<<((ostream *)&vtx,"layout(location = 0) out mediump vec4 v_color;\n");
    std::operator<<((ostream *)&frag,"layout(location = 0) in mediump vec4 v_color;\n");
  }
  local_454 = (byte)local_460 + 1;
  local_480 = 0;
  local_400 = ";\n";
  local_448 = 0;
  local_464 = 0;
LAB_005a950c:
  pSVar2 = local_478;
  if (local_480 < (int)local_454) {
    lVar11 = 0xe0;
    if (0 < local_480) {
      lVar11 = 0xec;
    }
    local_460 = glu::getPrecisionName
                          (*(Precision *)
                            ((long)&(local_478->super_ShaderRenderCase).super_TestCase.
                                    super_TestCase.super_TestNode.m_testCtx + lVar11));
    pcVar8 = glu::getDataTypeName
                       (*(DataType *)
                         ((long)&(pSVar2->super_ShaderRenderCase).super_TestCase.super_TestCase.
                                 super_TestNode._vptr_TestNode + lVar11 + 4));
    local_450 = &inValue0;
    if (0 < local_480) {
      local_450 = &inValue1;
    }
    iVar7 = *(int *)((long)&(pSVar2->super_ShaderRenderCase).super_TestCase.super_TestCase.
                            super_TestNode._vptr_TestNode + lVar11);
    if (iVar7 == 0) {
      poVar9 = std::operator<<((ostream *)poVar17,"const ");
      poVar9 = std::operator<<(poVar9,local_460);
      poVar9 = std::operator<<(poVar9," ");
      poVar9 = std::operator<<(poVar9,pcVar8);
      poVar9 = std::operator<<(poVar9," in");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_480);
      std::operator<<(poVar9," = ");
      switch(*(undefined4 *)
              ((long)&(local_478->super_ShaderRenderCase).super_TestCase.super_TestCase.
                      super_TestNode._vptr_TestNode + lVar11 + 4)) {
      case 1:
        de::floatToString_abi_cxx11_
                  (local_440,(de *)0x1,
                   *(float *)((long)&sr::(anonymous_namespace)::s_constInFloat + (long)local_480 * 4
                             ),precision);
        std::operator<<((ostream *)poVar17,(string *)local_440);
        std::__cxx11::string::~string((string *)local_440);
        break;
      case 2:
        lVar11 = (long)local_480;
        poVar9 = std::operator<<((ostream *)poVar17,"vec");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,2);
        std::operator<<(poVar9,"(");
        lVar16 = 0;
        uVar10 = extraout_RDX_13;
        do {
          iVar7 = (int)uVar10;
          if (lVar16 != 0) {
            if (lVar16 == 2) goto LAB_005aa04e;
            std::operator<<((ostream *)poVar17,", ");
            iVar7 = extraout_EDX_06;
          }
          de::floatToString_abi_cxx11_
                    (local_440,(de *)0x1,
                     *(float *)(sr::(anonymous_namespace)::s_constInVec2 + lVar16 * 4 + lVar11 * 8),
                     iVar7);
          std::operator<<((ostream *)poVar17,(string *)local_440);
          std::__cxx11::string::~string((string *)local_440);
          lVar16 = lVar16 + 1;
          uVar10 = extraout_RDX_14;
        } while( true );
      case 3:
        lVar11 = (long)local_480;
        poVar9 = std::operator<<((ostream *)poVar17,"vec");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,3);
        std::operator<<(poVar9,"(");
        lVar16 = 0;
        uVar10 = extraout_RDX_07;
        do {
          iVar7 = (int)uVar10;
          if (lVar16 != 0) {
            if (lVar16 == 3) goto LAB_005aa04e;
            std::operator<<((ostream *)poVar17,", ");
            iVar7 = extraout_EDX_03;
          }
          de::floatToString_abi_cxx11_
                    (local_440,(de *)0x1,
                     *(float *)(sr::(anonymous_namespace)::s_constInVec3 + lVar16 * 4 + lVar11 * 0xc
                               ),iVar7);
          std::operator<<((ostream *)poVar17,(string *)local_440);
          std::__cxx11::string::~string((string *)local_440);
          lVar16 = lVar16 + 1;
          uVar10 = extraout_RDX_08;
        } while( true );
      case 4:
        lVar11 = (long)local_480;
        poVar9 = std::operator<<((ostream *)poVar17,"vec");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,4);
        std::operator<<(poVar9,"(");
        lVar16 = 0;
        uVar10 = extraout_RDX_09;
        do {
          iVar7 = (int)uVar10;
          if (lVar16 != 0) {
            if (lVar16 == 4) goto LAB_005aa04e;
            std::operator<<((ostream *)poVar17,", ");
            iVar7 = extraout_EDX_04;
          }
          de::floatToString_abi_cxx11_
                    (local_440,(de *)0x1,
                     *(float *)(sr::(anonymous_namespace)::s_constInVec4 +
                               lVar16 * 4 + lVar11 * 0x10),iVar7);
          std::operator<<((ostream *)poVar17,(string *)local_440);
          std::__cxx11::string::~string((string *)local_440);
          lVar16 = lVar16 + 1;
          uVar10 = extraout_RDX_10;
        } while( true );
      case 5:
        tcu::Matrix<float,_2,_2>::Matrix
                  ((Matrix<float,_2,_2> *)&local_3f8,
                   (float *)(sr::(anonymous_namespace)::s_constInMat2x2 + (long)local_480 * 0x10));
        poVar9 = std::operator<<((ostream *)poVar17,"mat");
        std::ostream::operator<<(poVar9,2);
        std::operator<<((ostream *)poVar17,"(");
        uVar10 = extraout_RDX_01;
        psVar12 = &local_3f8;
        for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
          for (lVar16 = 0; iVar7 = (int)uVar10, lVar16 != 2; lVar16 = lVar16 + 1) {
            if (lVar11 == 1 || lVar16 == 1) {
              std::operator<<((ostream *)poVar17,", ");
              iVar7 = extraout_EDX_00;
            }
            de::floatToString_abi_cxx11_
                      (local_440,(de *)0x1,
                       *(float *)((long)&(psVar12->_M_dataplus)._M_p + lVar16 * 4),iVar7);
            std::operator<<((ostream *)poVar17,(string *)local_440);
            std::__cxx11::string::~string((string *)local_440);
            uVar10 = extraout_RDX_02;
          }
          psVar12 = (string *)&psVar12->_M_string_length;
        }
        std::operator<<((ostream *)poVar17,")");
        break;
      case 6:
        tcu::Matrix<float,_3,_2>::Matrix
                  ((Matrix<float,_3,_2> *)&local_3f8,
                   (float *)(sr::(anonymous_namespace)::s_constInMat2x3 + (long)local_480 * 0x18));
        poVar9 = std::operator<<((ostream *)poVar17,"mat");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,2);
        poVar9 = std::operator<<(poVar9,"x");
        std::ostream::operator<<(poVar9,3);
        std::operator<<((ostream *)poVar17,"(");
        uVar10 = extraout_RDX_15;
        psVar12 = &local_3f8;
        for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
          for (lVar16 = 0; iVar7 = (int)uVar10, lVar16 != 3; lVar16 = lVar16 + 1) {
            if (lVar11 == 1 || lVar16 != 0) {
              std::operator<<((ostream *)poVar17,", ");
              iVar7 = extraout_EDX_07;
            }
            de::floatToString_abi_cxx11_
                      (local_440,(de *)0x1,
                       *(float *)((long)&(psVar12->_M_dataplus)._M_p + lVar16 * 4),iVar7);
            std::operator<<((ostream *)poVar17,(string *)local_440);
            std::__cxx11::string::~string((string *)local_440);
            uVar10 = extraout_RDX_16;
          }
          psVar12 = (string *)((long)&psVar12->_M_string_length + 4);
        }
        std::operator<<((ostream *)poVar17,")");
        break;
      case 7:
        tcu::Matrix<float,_4,_2>::Matrix
                  ((Matrix<float,_4,_2> *)&local_3f8,
                   (float *)(sr::(anonymous_namespace)::s_constInMat2x4 + (long)local_480 * 0x20));
        poVar9 = std::operator<<((ostream *)poVar17,"mat");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,2);
        poVar9 = std::operator<<(poVar9,"x");
        std::ostream::operator<<(poVar9,4);
        std::operator<<((ostream *)poVar17,"(");
        uVar10 = extraout_RDX_17;
        psVar12 = &local_3f8;
        for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
          for (lVar16 = 0; iVar7 = (int)uVar10, lVar16 != 4; lVar16 = lVar16 + 1) {
            if (lVar11 == 1 || lVar16 != 0) {
              std::operator<<((ostream *)poVar17,", ");
              iVar7 = extraout_EDX_08;
            }
            de::floatToString_abi_cxx11_
                      (local_440,(de *)0x1,
                       *(float *)((long)&(psVar12->_M_dataplus)._M_p + lVar16 * 4),iVar7);
            std::operator<<((ostream *)poVar17,(string *)local_440);
            std::__cxx11::string::~string((string *)local_440);
            uVar10 = extraout_RDX_18;
          }
          psVar12 = (string *)&psVar12->field_2;
        }
        std::operator<<((ostream *)poVar17,")");
        break;
      case 8:
        tcu::Matrix<float,_2,_3>::Matrix
                  ((Matrix<float,_2,_3> *)&local_3f8,
                   (float *)(sr::(anonymous_namespace)::s_constInMat3x2 + (long)local_480 * 0x18));
        poVar9 = std::operator<<((ostream *)poVar17,"mat");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,3);
        poVar9 = std::operator<<(poVar9,"x");
        std::ostream::operator<<(poVar9,2);
        std::operator<<((ostream *)poVar17,"(");
        uVar10 = extraout_RDX_11;
        psVar12 = &local_3f8;
        for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
          for (lVar16 = 0; iVar7 = (int)uVar10, lVar16 != 2; lVar16 = lVar16 + 1) {
            if (lVar11 != 0 || lVar16 == 1) {
              std::operator<<((ostream *)poVar17,", ");
              iVar7 = extraout_EDX_05;
            }
            de::floatToString_abi_cxx11_
                      (local_440,(de *)0x1,
                       *(float *)((long)&(psVar12->_M_dataplus)._M_p + lVar16 * 4),iVar7);
            std::operator<<((ostream *)poVar17,(string *)local_440);
            std::__cxx11::string::~string((string *)local_440);
            uVar10 = extraout_RDX_12;
          }
          psVar12 = (string *)&psVar12->_M_string_length;
        }
        std::operator<<((ostream *)poVar17,")");
        break;
      case 9:
        tcu::Matrix<float,_3,_3>::Matrix
                  ((Matrix<float,_3,_3> *)local_440,
                   (float *)(sr::(anonymous_namespace)::s_constInMat3x3 + (long)local_480 * 0x24));
        poVar9 = std::operator<<((ostream *)poVar17,"mat");
        std::ostream::operator<<(poVar9,3);
        std::operator<<((ostream *)poVar17,"(");
        uVar10 = extraout_RDX_21;
        pbVar13 = local_440;
        for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
          for (lVar16 = 0; iVar7 = (int)uVar10, lVar16 != 3; lVar16 = lVar16 + 1) {
            if ((int)lVar16 != 0 || (int)lVar11 != 0) {
              std::operator<<((ostream *)poVar17,", ");
              iVar7 = extraout_EDX_10;
            }
            de::floatToString_abi_cxx11_
                      (&local_3f8,(de *)0x1,
                       *(float *)((long)&(pbVar13->_M_dataplus)._M_p + lVar16 * 4),iVar7);
            std::operator<<((ostream *)poVar17,(string *)&local_3f8);
            std::__cxx11::string::~string((string *)&local_3f8);
            uVar10 = extraout_RDX_22;
          }
          pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)&pbVar13->_M_string_length + 4);
        }
        std::operator<<((ostream *)poVar17,")");
        break;
      case 10:
        tcu::Matrix<float,_4,_3>::Matrix
                  ((Matrix<float,_4,_3> *)local_440,
                   (float *)(sr::(anonymous_namespace)::s_constInMat3x4 + (long)local_480 * 0x30));
        poVar9 = std::operator<<((ostream *)poVar17,"mat");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,3);
        poVar9 = std::operator<<(poVar9,"x");
        std::ostream::operator<<(poVar9,4);
        std::operator<<((ostream *)poVar17,"(");
        uVar10 = extraout_RDX_05;
        pbVar13 = local_440;
        for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
          for (lVar16 = 0; iVar7 = (int)uVar10, lVar16 != 4; lVar16 = lVar16 + 1) {
            if ((int)lVar16 != 0 || (int)lVar11 != 0) {
              std::operator<<((ostream *)poVar17,", ");
              iVar7 = extraout_EDX_02;
            }
            de::floatToString_abi_cxx11_
                      (&local_3f8,(de *)0x1,
                       *(float *)((long)&(pbVar13->_M_dataplus)._M_p + lVar16 * 4),iVar7);
            std::operator<<((ostream *)poVar17,(string *)&local_3f8);
            std::__cxx11::string::~string((string *)&local_3f8);
            uVar10 = extraout_RDX_06;
          }
          pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &pbVar13->field_2;
        }
        std::operator<<((ostream *)poVar17,")");
        break;
      case 0xb:
        tcu::Matrix<float,_2,_4>::Matrix
                  ((Matrix<float,_2,_4> *)&local_3f8,
                   (float *)(sr::(anonymous_namespace)::s_constInMat4x2 + (long)local_480 * 0x20));
        poVar9 = std::operator<<((ostream *)poVar17,"mat");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,4);
        poVar9 = std::operator<<(poVar9,"x");
        std::ostream::operator<<(poVar9,2);
        std::operator<<((ostream *)poVar17,"(");
        uVar10 = extraout_RDX_19;
        psVar12 = &local_3f8;
        for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
          for (lVar16 = 0; iVar7 = (int)uVar10, lVar16 != 2; lVar16 = lVar16 + 1) {
            if (lVar11 != 0 || lVar16 == 1) {
              std::operator<<((ostream *)poVar17,", ");
              iVar7 = extraout_EDX_09;
            }
            de::floatToString_abi_cxx11_
                      (local_440,(de *)0x1,
                       *(float *)((long)&(psVar12->_M_dataplus)._M_p + lVar16 * 4),iVar7);
            std::operator<<((ostream *)poVar17,(string *)local_440);
            std::__cxx11::string::~string((string *)local_440);
            uVar10 = extraout_RDX_20;
          }
          psVar12 = (string *)&psVar12->_M_string_length;
        }
        std::operator<<((ostream *)poVar17,")");
        break;
      case 0xc:
        tcu::Matrix<float,_3,_4>::Matrix
                  ((Matrix<float,_3,_4> *)local_440,
                   (float *)(sr::(anonymous_namespace)::s_constInMat4x3 + (long)local_480 * 0x30));
        poVar9 = std::operator<<((ostream *)poVar17,"mat");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,4);
        poVar9 = std::operator<<(poVar9,"x");
        std::ostream::operator<<(poVar9,3);
        std::operator<<((ostream *)poVar17,"(");
        uVar10 = extraout_RDX;
        pbVar13 = local_440;
        for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
          for (lVar16 = 0; iVar7 = (int)uVar10, lVar16 != 3; lVar16 = lVar16 + 1) {
            if ((int)lVar16 != 0 || (int)lVar11 != 0) {
              std::operator<<((ostream *)poVar17,", ");
              iVar7 = extraout_EDX;
            }
            de::floatToString_abi_cxx11_
                      (&local_3f8,(de *)0x1,
                       *(float *)((long)&(pbVar13->_M_dataplus)._M_p + lVar16 * 4),iVar7);
            std::operator<<((ostream *)poVar17,(string *)&local_3f8);
            std::__cxx11::string::~string((string *)&local_3f8);
            uVar10 = extraout_RDX_00;
          }
          pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)&pbVar13->_M_string_length + 4);
        }
        std::operator<<((ostream *)poVar17,")");
        break;
      case 0xd:
        tcu::Matrix<float,_4,_4>::Matrix
                  ((Matrix<float,_4,_4> *)local_440,
                   (float *)(sr::(anonymous_namespace)::s_constInMat4x4 + (long)local_480 * 0x40));
        poVar9 = std::operator<<((ostream *)poVar17,"mat");
        std::ostream::operator<<(poVar9,4);
        std::operator<<((ostream *)poVar17,"(");
        uVar10 = extraout_RDX_03;
        pbVar13 = local_440;
        for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
          for (lVar16 = 0; iVar7 = (int)uVar10, lVar16 != 4; lVar16 = lVar16 + 1) {
            if ((int)lVar16 != 0 || (int)lVar11 != 0) {
              std::operator<<((ostream *)poVar17,", ");
              iVar7 = extraout_EDX_01;
            }
            de::floatToString_abi_cxx11_
                      (&local_3f8,(de *)0x1,
                       *(float *)((long)&(pbVar13->_M_dataplus)._M_p + lVar16 * 4),iVar7);
            std::operator<<((ostream *)poVar17,(string *)&local_3f8);
            std::__cxx11::string::~string((string *)&local_3f8);
            uVar10 = extraout_RDX_04;
          }
          pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &pbVar13->field_2;
        }
        std::operator<<((ostream *)poVar17,")");
      }
      goto switchD_005a9964_default;
    }
    if (iVar7 == 1) {
      poVar9 = std::operator<<((ostream *)poVar17,"layout(std140, set = 0, binding = ");
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      poVar9 = std::operator<<(poVar9,") uniform buffer");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_480);
      poVar9 = std::operator<<(poVar9," { ");
      poVar9 = std::operator<<(poVar9,local_460);
      poVar9 = std::operator<<(poVar9," ");
      poVar9 = std::operator<<(poVar9,pcVar8);
      poVar9 = std::operator<<(poVar9," u_in");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_480);
      std::operator<<(poVar9,"; };\n");
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"u_in",&local_465);
      de::toString<int>(&local_380,&local_480);
      std::operator+(local_440,&local_3f8,&local_380);
      local_464 = local_464 + 1;
      goto LAB_005aa443;
    }
    if (iVar7 == 2) {
      iVar7 = *(int *)((long)&(local_478->super_ShaderRenderCase).super_TestCase.super_TestCase.
                              super_TestNode._vptr_TestNode + lVar11 + 4);
      if (iVar7 - 5U < 9 || iVar7 - 0x12U < 9) {
        poVar9 = std::operator<<((ostream *)&vtx,"layout(location = ");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9,") in ");
        poVar9 = std::operator<<(poVar9,local_460);
        poVar9 = std::operator<<(poVar9," ");
        poVar9 = std::operator<<(poVar9,pcVar8);
        std::operator<<(poVar9," a_");
        poVar9 = std::operator<<((ostream *)&vtx,pcVar8);
        std::operator<<(poVar9,";\n");
        pcVar15 = "a_";
        if ((local_478->super_ShaderRenderCase).m_isVertexCase == false) {
          poVar9 = std::operator<<((ostream *)&vtx,"layout(location = ");
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          poVar9 = std::operator<<(poVar9,") out ");
          poVar9 = std::operator<<(poVar9,local_460);
          poVar9 = std::operator<<(poVar9," ");
          poVar9 = std::operator<<(poVar9,pcVar8);
          poVar9 = std::operator<<(poVar9," v_");
          poVar9 = std::operator<<(poVar9,pcVar8);
          std::operator<<(poVar9,";\n");
          poVar9 = std::operator<<((ostream *)&frag,"layout(location = ");
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          poVar9 = std::operator<<(poVar9,") in ");
          poVar9 = std::operator<<(poVar9,local_460);
          poVar9 = std::operator<<(poVar9," ");
          poVar9 = std::operator<<(poVar9,pcVar8);
          poVar9 = std::operator<<(poVar9," v_");
          poVar9 = std::operator<<(poVar9,pcVar8);
          std::operator<<(poVar9,";\n");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_440,pcVar8,(allocator<char> *)&local_3f8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&passVars,
                     local_440);
          std::__cxx11::string::~string((string *)local_440);
          pcVar15 = "v_";
          if (((local_478->super_ShaderRenderCase).m_isVertexCase & 1U) != 0) {
            pcVar15 = "a_";
          }
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3f8,pcVar15,(allocator<char> *)&local_380);
        pcVar8 = glu::getDataTypeName
                           (*(DataType *)
                             ((long)&(local_478->super_ShaderRenderCase).super_TestCase.
                                     super_TestCase.super_TestNode._vptr_TestNode + lVar11 + 4));
        std::operator+(local_440,&local_3f8,pcVar8);
        std::__cxx11::string::operator=((string *)local_450,(string *)local_440);
        std::__cxx11::string::~string((string *)local_440);
        std::__cxx11::string::~string((string *)&local_3f8);
        iVar7 = glu::getDataTypeMatrixNumColumns
                          (*(DataType *)
                            ((long)&(local_478->super_ShaderRenderCase).super_TestCase.
                                    super_TestCase.super_TestNode._vptr_TestNode + lVar11 + 4));
        local_448 = (ulong)(uint)(iVar7 + (int)local_448);
      }
      else {
        poVar9 = std::operator<<((ostream *)&vtx,"layout(location = 1) in ");
        poVar9 = std::operator<<(poVar9,local_460);
        poVar9 = std::operator<<(poVar9," ");
        poVar9 = std::operator<<(poVar9,pcVar8);
        std::operator<<(poVar9," a_coords;\n");
        if ((local_478->super_ShaderRenderCase).m_isVertexCase == false) {
          poVar9 = std::operator<<((ostream *)&vtx,"layout(location = ");
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          poVar9 = std::operator<<(poVar9,") out ");
          poVar9 = std::operator<<(poVar9,local_460);
          poVar9 = std::operator<<(poVar9," ");
          poVar9 = std::operator<<(poVar9,pcVar8);
          std::operator<<(poVar9," v_coords;\n");
          poVar9 = std::operator<<((ostream *)&frag,"layout(location = ");
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          poVar9 = std::operator<<(poVar9,") in ");
          poVar9 = std::operator<<(poVar9,local_460);
          poVar9 = std::operator<<(poVar9," ");
          poVar9 = std::operator<<(poVar9,pcVar8);
          std::operator<<(poVar9," v_coords;\n");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_440,"coords",(allocator<char> *)&local_3f8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&passVars,
                     local_440);
          std::__cxx11::string::~string((string *)local_440);
        }
        std::__cxx11::string::assign((char *)local_450);
      }
    }
    goto LAB_005aa468;
  }
  poVar9 = std::operator<<((ostream *)&vtx,"\n");
  poVar9 = std::operator<<(poVar9,"void main (void)\n");
  poVar9 = std::operator<<(poVar9,"{\n");
  std::operator<<(poVar9,"\tgl_Position = a_position;\n");
  poVar9 = std::operator<<((ostream *)&frag,"\n");
  poVar9 = std::operator<<(poVar9,"void main (void)\n");
  std::operator<<(poVar9,"{\n");
  if ((local_478->super_ShaderRenderCase).m_isVertexCase == true) {
    std::operator<<((ostream *)&frag,"\tdEQP_FragColor = v_color;\n");
  }
  else {
    for (pbVar14 = passVars.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar14 !=
        passVars.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar14 = pbVar14 + 1) {
      poVar9 = std::operator<<((ostream *)&vtx,"\tv_");
      poVar9 = std::operator<<(poVar9,(string *)pbVar14);
      poVar9 = std::operator<<(poVar9," = ");
      poVar9 = std::operator<<(poVar9,"a_");
      poVar9 = std::operator<<(poVar9,(string *)pbVar14);
      std::operator<<(poVar9,";\n");
    }
  }
  if (local_478->m_op - OP_PRE_INCREMENT < 4) {
    poVar9 = std::operator<<((ostream *)poVar17,"\t");
    pcVar8 = glu::getPrecisionName(local_46c);
    poVar9 = std::operator<<(poVar9,pcVar8);
    poVar9 = std::operator<<(poVar9," ");
    pcVar8 = glu::getDataTypeName(resultType);
    poVar9 = std::operator<<(poVar9,pcVar8);
    poVar9 = std::operator<<(poVar9," tmpValue = ");
    poVar9 = std::operator<<(poVar9,(string *)&inValue0);
    std::operator<<(poVar9,";\n");
    std::__cxx11::string::assign((char *)&operationValue0);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&operationValue0);
  }
  psVar12 = &operationValue1;
  std::__cxx11::string::_M_assign((string *)psVar12);
  OVar4 = MatrixCaseUtils::getOperationType(local_478->m_op);
  switch(OVar4) {
  case OPERATIONTYPE_BINARY_OPERATOR:
    poVar9 = std::operator<<((ostream *)poVar17,"\t");
    pcVar8 = glu::getPrecisionName(local_46c);
    poVar9 = std::operator<<(poVar9,pcVar8);
    pcVar8 = " ";
    poVar9 = std::operator<<(poVar9," ");
    pcVar15 = glu::getDataTypeName(resultType);
    poVar9 = std::operator<<(poVar9,pcVar15);
    poVar9 = std::operator<<(poVar9," res = ");
    poVar9 = std::operator<<(poVar9,(string *)&operationValue0);
    break;
  case OPERATIONTYPE_BINARY_FUNCTION:
    poVar9 = std::operator<<((ostream *)poVar17,"\t");
    pcVar8 = glu::getPrecisionName(local_46c);
    poVar9 = std::operator<<(poVar9,pcVar8);
    poVar9 = std::operator<<(poVar9," ");
    pcVar8 = glu::getDataTypeName(resultType);
    poVar9 = std::operator<<(poVar9,pcVar8);
    poVar9 = std::operator<<(poVar9," res = ");
    pcVar8 = MatrixCaseUtils::getOperationName(local_478->m_op);
    poVar9 = std::operator<<(poVar9,pcVar8);
    poVar9 = std::operator<<(poVar9,"(");
    poVar9 = std::operator<<(poVar9,(string *)&operationValue0);
    poVar9 = std::operator<<(poVar9,", ");
    goto LAB_005aa953;
  case OPERATIONTYPE_UNARY_PREFIX_OPERATOR:
    poVar9 = std::operator<<((ostream *)poVar17,"\t");
    pcVar8 = glu::getPrecisionName(local_46c);
    poVar9 = std::operator<<(poVar9,pcVar8);
    poVar9 = std::operator<<(poVar9," ");
    pcVar8 = glu::getDataTypeName(resultType);
    poVar9 = std::operator<<(poVar9,pcVar8);
    poVar9 = std::operator<<(poVar9," res = ");
    pcVar8 = MatrixCaseUtils::getOperationName(local_478->m_op);
    poVar9 = std::operator<<(poVar9,pcVar8);
    psVar12 = &operationValue0;
    goto LAB_005aaa33;
  case OPERATIONTYPE_UNARY_POSTFIX_OPERATOR:
    poVar9 = std::operator<<((ostream *)poVar17,"\t");
    pcVar8 = glu::getPrecisionName(local_46c);
    poVar9 = std::operator<<(poVar9,pcVar8);
    poVar9 = std::operator<<(poVar9," ");
    pcVar8 = glu::getDataTypeName(resultType);
    poVar9 = std::operator<<(poVar9,pcVar8);
    poVar9 = std::operator<<(poVar9," res = ");
    poVar9 = std::operator<<(poVar9,(string *)&operationValue0);
    pcVar8 = MatrixCaseUtils::getOperationName(local_478->m_op);
    poVar9 = std::operator<<(poVar9,pcVar8);
    goto LAB_005aaa3b;
  case OPERATIONTYPE_UNARY_FUNCTION:
    poVar9 = std::operator<<((ostream *)poVar17,"\t");
    pcVar8 = glu::getPrecisionName(local_46c);
    poVar9 = std::operator<<(poVar9,pcVar8);
    poVar9 = std::operator<<(poVar9," ");
    pcVar8 = glu::getDataTypeName(resultType);
    poVar9 = std::operator<<(poVar9,pcVar8);
    poVar9 = std::operator<<(poVar9," res = ");
    pcVar8 = MatrixCaseUtils::getOperationName(local_478->m_op);
    poVar9 = std::operator<<(poVar9,pcVar8);
    poVar9 = std::operator<<(poVar9,"(");
    psVar12 = &operationValue0;
LAB_005aa953:
    poVar9 = std::operator<<(poVar9,(string *)psVar12);
    local_400 = ");\n";
    goto LAB_005aaa3b;
  case OPERATIONTYPE_ASSIGNMENT:
    poVar9 = std::operator<<((ostream *)poVar17,"\t");
    pcVar8 = glu::getPrecisionName(local_46c);
    poVar9 = std::operator<<(poVar9,pcVar8);
    poVar9 = std::operator<<(poVar9," ");
    pcVar8 = glu::getDataTypeName(resultType);
    poVar9 = std::operator<<(poVar9,pcVar8);
    poVar9 = std::operator<<(poVar9," res = ");
    poVar9 = std::operator<<(poVar9,(string *)&operationValue0);
    std::operator<<(poVar9,";\n");
    pcVar8 = "\tres ";
    poVar9 = (ostream *)poVar17;
    break;
  default:
    goto switchD_005aa68b_default;
  }
  poVar9 = std::operator<<(poVar9,pcVar8);
  pcVar8 = MatrixCaseUtils::getOperationName(local_478->m_op);
  poVar9 = std::operator<<(poVar9,pcVar8);
  poVar9 = std::operator<<(poVar9," ");
  psVar12 = &operationValue1;
LAB_005aaa33:
  poVar9 = std::operator<<(poVar9,(string *)psVar12);
LAB_005aaa3b:
  std::operator<<(poVar9,local_400);
switchD_005aa68b_default:
  poVar9 = std::operator<<((ostream *)poVar17,"\t");
  pcVar8 = "v_color";
  pcVar15 = "dEQP_FragColor";
  if ((local_478->super_ShaderRenderCase).m_isVertexCase != false) {
    pcVar15 = "v_color";
  }
  poVar9 = std::operator<<(poVar9,pcVar15);
  std::operator<<(poVar9," = ");
  if (local_478->m_op - OP_PRE_INCREMENT < 4) {
    poVar9 = std::operator<<((ostream *)poVar17,"vec4(");
    sr::(anonymous_namespace)::ShaderMatrixCase::genGLSLMatToVec3Reduction_abi_cxx11_
              (local_440,&resultType,(DataType *)0x96fbf0,pcVar8);
    poVar9 = std::operator<<(poVar9,(string *)local_440);
    poVar9 = std::operator<<(poVar9,", 1.0) + vec4(");
    sr::(anonymous_namespace)::ShaderMatrixCase::genGLSLMatToVec3Reduction_abi_cxx11_
              (&local_3f8,&resultType,(DataType *)"tmpValue",pcVar8);
    poVar9 = std::operator<<(poVar9,(string *)&local_3f8);
    std::operator<<(poVar9,", 0.0);\n");
    std::__cxx11::string::~string((string *)&local_3f8);
  }
  else {
    poVar9 = std::operator<<((ostream *)poVar17,"vec4(");
    sr::(anonymous_namespace)::ShaderMatrixCase::genGLSLMatToVec3Reduction_abi_cxx11_
              (local_440,&resultType,(DataType *)0x96fbf0,pcVar8);
    poVar9 = std::operator<<(poVar9,(string *)local_440);
    std::operator<<(poVar9,", 1.0);\n");
  }
  std::__cxx11::string::~string((string *)local_440);
  std::operator<<((ostream *)&vtx,"}\n");
  std::operator<<((ostream *)&frag,"}\n");
  std::__cxx11::stringbuf::str();
  pSVar2 = local_478;
  std::__cxx11::string::operator=
            ((string *)&(local_478->super_ShaderRenderCase).m_vertShaderSource,(string *)local_440);
  std::__cxx11::string::~string((string *)local_440);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(pSVar2->super_ShaderRenderCase).m_fragShaderSource,(string *)local_440);
  std::__cxx11::string::~string((string *)local_440);
  std::__cxx11::string::~string((string *)&operationValue1);
  std::__cxx11::string::~string((string *)&operationValue0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&passVars);
  std::__cxx11::string::~string((string *)&inValue1);
  std::__cxx11::string::~string((string *)&inValue0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
  return;
LAB_005aa04e:
  std::operator<<((ostream *)poVar17,")");
switchD_005a9964_default:
  std::operator<<((ostream *)poVar17,";\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"in",&local_465);
  de::toString<int>(&local_380,&local_480);
  std::operator+(local_440,&local_3f8,&local_380);
LAB_005aa443:
  std::__cxx11::string::operator=((string *)local_450,(string *)local_440);
  std::__cxx11::string::~string((string *)local_440);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_3f8);
LAB_005aa468:
  local_480 = local_480 + 1;
  goto LAB_005a950c;
}

Assistant:

void ShaderMatrixCase::setupShader (void)
{
	std::ostringstream	vtx;
	std::ostringstream	frag;
	std::ostringstream&	op				= m_isVertexCase ? vtx : frag;

	bool				isInDynMat0		= isDataTypeMatrix(m_in0.dataType) && m_in0.inputType == INPUTTYPE_DYNAMIC;
	bool				isInDynMat1		= isDataTypeMatrix(m_in1.dataType) && m_in1.inputType == INPUTTYPE_DYNAMIC;
	string				inValue0;
	string				inValue1;
	DataType			resultType		= TYPE_LAST;
	Precision			resultPrec		= m_in0.precision;
	vector<string>		passVars;
	int					numInputs		= (isOperationBinary(m_op)) ? (2) : (1);

	std::string			operationValue0;
	std::string			operationValue1;

	DE_ASSERT(!isInDynMat0 || !isInDynMat1); // Only single dynamic matrix input is allowed.
	DE_UNREF(isInDynMat0 && isInDynMat1);

	// Compute result type.
	if (m_op == OP_MUL && isDataTypeMatrix(m_in0.dataType) && isDataTypeMatrix(m_in1.dataType))
	{
		resultType = getDataTypeMatrix(getDataTypeMatrixNumColumns(m_in1.dataType), getDataTypeMatrixNumRows(m_in0.dataType));
	}
	else if (m_op == OP_OUTER_PRODUCT)
	{
		resultType = getDataTypeMatrix(getDataTypeScalarSize(m_in1.dataType), getDataTypeScalarSize(m_in0.dataType));
	}
	else if (m_op == OP_TRANSPOSE)
	{
		resultType = getDataTypeMatrix(getDataTypeMatrixNumRows(m_in0.dataType), getDataTypeMatrixNumColumns(m_in0.dataType));
	}
	else if (m_op == OP_INVERSE)
	{
		resultType = m_in0.dataType;
	}
	else if (m_op == OP_DETERMINANT)
	{
		resultType = TYPE_FLOAT;
	}
	else if (getOperationType(m_op) == OPERATIONTYPE_UNARY_PREFIX_OPERATOR ||
			 getOperationType(m_op) == OPERATIONTYPE_UNARY_POSTFIX_OPERATOR)
	{
		resultType = m_in0.dataType;
	}
	else if (isDataTypeMatrix(m_in0.dataType) && isDataTypeMatrix(m_in1.dataType))
	{
		DE_ASSERT(m_in0.dataType == m_in1.dataType);
		resultType = m_in0.dataType;
	}
	else if (isDataTypeMatrix(m_in0.dataType) || isDataTypeMatrix(m_in1.dataType))
	{
		int			matNdx		= isDataTypeMatrix(m_in0.dataType) ? 0 : 1;
		DataType	matrixType	= matNdx == 0 ? m_in0.dataType : m_in1.dataType;
		DataType	otherType	= matNdx == 0 ? m_in1.dataType : m_in0.dataType;

		if (otherType == TYPE_FLOAT)
			resultType = matrixType;
		else
		{
			DE_ASSERT(isDataTypeVector(otherType));
			resultType = getDataTypeFloatVec(matNdx == 0 ? getDataTypeMatrixNumRows(matrixType) : getDataTypeMatrixNumColumns(matrixType));
		}
	}
	else
	{
		DE_ASSERT(DE_FALSE);
	}

	static const std::string header =
		"#version 310 es\n";

	vtx << header;
	frag << header;

	vtx << "layout(location = 0) in highp vec4 a_position;\n";
	frag << "layout(location = 0) out mediump vec4 dEQP_FragColor;\n";
	if (m_isVertexCase)
	{
		vtx << "layout(location = 0) out mediump vec4 v_color;\n";
		frag << "layout(location = 0) in mediump vec4 v_color;\n";
	}

	// Input declarations.
	deUint32 uniformBinding = 0;
	deUint32 padding = 0;
	for (int inNdx = 0; inNdx < numInputs; inNdx++)
	{
		const ShaderInput&	in			= inNdx > 0 ? m_in1 : m_in0;
		const char*			precName	= getPrecisionName(in.precision);
		const char*			typeName	= getDataTypeName(in.dataType);
		string&				inValue		= inNdx > 0 ? inValue1 : inValue0;

		if (in.inputType == INPUTTYPE_DYNAMIC)
		{
			if (isDataTypeMatrix(in.dataType))
			{
				vtx << "layout(location = " << 4 + inNdx + padding << ") in " << precName << " " << typeName << " a_";
				// a_matN, v_matN
				vtx << typeName << ";\n";
				if (!m_isVertexCase)
				{
					vtx << "layout(location = " << 1 + inNdx + padding << ") out " << precName << " " << typeName << " v_" << typeName << ";\n";
					frag << "layout(location = " << 1 + inNdx + padding << ") in " << precName << " " << typeName << " v_" << typeName << ";\n";
					passVars.push_back(typeName);
				}

				inValue = string(m_isVertexCase ? "a_" : "v_") + getDataTypeName(in.dataType);
				padding += getDataTypeMatrixNumColumns(in.dataType);
			}
			else
			{
				// a_coords, v_coords
				vtx << "layout(location = 1) in " << precName << " " << typeName << " a_coords;\n";
				if (!m_isVertexCase)
				{
					vtx << "layout(location = " << 1 + padding << ") out " << precName << " " << typeName << " v_coords;\n";
					frag << "layout(location = " << 1 + padding << ") in " << precName << " " << typeName << " v_coords;\n";
					passVars.push_back("coords");
				}

				inValue = m_isVertexCase ? "a_coords" : "v_coords";
			}
		}
		else if (in.inputType == INPUTTYPE_UNIFORM)
		{
			op << "layout(std140, set = 0, binding = " << uniformBinding++ <<  ") uniform buffer"<< inNdx <<" { " << precName << " " << typeName << " u_in" << inNdx << "; };\n";
			inValue = string("u_in") + de::toString(inNdx);
		}
		else if (in.inputType == INPUTTYPE_CONST)
		{
			op << "const " << precName << " " << typeName << " in" << inNdx << " = ";

			// Generate declaration.
			switch (in.dataType)
			{
				case TYPE_FLOAT:		op << de::floatToString(s_constInFloat[inNdx], 1);					break;
				case TYPE_FLOAT_VEC2:	writeVectorConstructor<2>(op, s_constInVec2[inNdx]);				break;
				case TYPE_FLOAT_VEC3:	writeVectorConstructor<3>(op, s_constInVec3[inNdx]);				break;
				case TYPE_FLOAT_VEC4:	writeVectorConstructor<4>(op, s_constInVec4[inNdx]);				break;
				case TYPE_FLOAT_MAT2:	writeMatrixConstructor<2, 2>(op, Mat2(s_constInMat2x2[inNdx]));		break;
				case TYPE_FLOAT_MAT2X3:	writeMatrixConstructor<2, 3>(op, Mat2x3(s_constInMat2x3[inNdx]));	break;
				case TYPE_FLOAT_MAT2X4:	writeMatrixConstructor<2, 4>(op, Mat2x4(s_constInMat2x4[inNdx]));	break;
				case TYPE_FLOAT_MAT3X2:	writeMatrixConstructor<3, 2>(op, Mat3x2(s_constInMat3x2[inNdx]));	break;
				case TYPE_FLOAT_MAT3:	writeMatrixConstructor<3, 3>(op, Mat3(s_constInMat3x3[inNdx]));		break;
				case TYPE_FLOAT_MAT3X4:	writeMatrixConstructor<3, 4>(op, Mat3x4(s_constInMat3x4[inNdx]));	break;
				case TYPE_FLOAT_MAT4X2:	writeMatrixConstructor<4, 2>(op, Mat4x2(s_constInMat4x2[inNdx]));	break;
				case TYPE_FLOAT_MAT4X3:	writeMatrixConstructor<4, 3>(op, Mat4x3(s_constInMat4x3[inNdx]));	break;
				case TYPE_FLOAT_MAT4:	writeMatrixConstructor<4, 4>(op, Mat4(s_constInMat4x4[inNdx]));		break;

				default:
					DE_ASSERT(DE_FALSE);
			}

			op << ";\n";

			inValue = string("in") + de::toString(inNdx);
		}
	}

	vtx << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	gl_Position = a_position;\n";
	frag << "\n"
		 << "void main (void)\n"
		 << "{\n";

	if (m_isVertexCase)
		frag << "	dEQP_FragColor = v_color;\n";
	else
	{
		for (vector<string>::const_iterator copyIter = passVars.begin(); copyIter != passVars.end(); copyIter++)
			vtx << "	v_" << *copyIter << " = " << "a_" << *copyIter << ";\n";
	}

	// Operation.

	switch (getOperationNature(m_op))
	{
		case OPERATIONNATURE_PURE:
			DE_ASSERT(getOperationType(m_op) != OPERATIONTYPE_ASSIGNMENT);

			operationValue0 = inValue0;
			operationValue1 = inValue1;
			break;

		case OPERATIONNATURE_MUTATING:
			DE_ASSERT(getOperationType(m_op) != OPERATIONTYPE_ASSIGNMENT);

			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " tmpValue = " << inValue0 << ";\n";

			operationValue0 = "tmpValue";
			operationValue1 = inValue1;
			break;

		case OPERATIONNATURE_ASSIGNMENT:
			DE_ASSERT(getOperationType(m_op) == OPERATIONTYPE_ASSIGNMENT);

			operationValue0 = inValue0;
			operationValue1 = inValue1;
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	switch (getOperationType(m_op))
	{
		case OPERATIONTYPE_BINARY_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << " " << getOperationName(m_op) << " " << operationValue1 << ";\n";
			break;

		case OPERATIONTYPE_UNARY_PREFIX_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << operationValue0 << ";\n";
			break;

		case OPERATIONTYPE_UNARY_POSTFIX_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << getOperationName(m_op) << ";\n";
			break;

		case OPERATIONTYPE_BINARY_FUNCTION:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << "(" << operationValue0 << ", " << operationValue1 << ");\n";
			break;

		case OPERATIONTYPE_UNARY_FUNCTION:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << "(" << operationValue0 << ");\n";
			break;

		case OPERATIONTYPE_ASSIGNMENT:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << ";\n";
			op << "	res " << getOperationName(m_op) << " " << operationValue1 << ";\n";
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	// Reduction to vec3 (rgb). Check the used value too if it was modified
	op << "	" << (m_isVertexCase ? "v_color" : "dEQP_FragColor") << " = ";

	if (isOperationValueModifying(m_op))
		op << "vec4(" << genGLSLMatToVec3Reduction(resultType, "res") << ", 1.0) + vec4(" << genGLSLMatToVec3Reduction(resultType, "tmpValue") << ", 0.0);\n";
	else
		op << "vec4(" << genGLSLMatToVec3Reduction(resultType, "res") << ", 1.0);\n";

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource	= vtx.str();
	m_fragShaderSource	= frag.str();
}